

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_ConvertSignatureFromDer_Test::
~ConfidentialTransactionContext_ConvertSignatureFromDer_Test
          (ConfidentialTransactionContext_ConvertSignatureFromDer_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, ConvertSignatureFromDer)
{
  SigHashType sighashtype;
  // 4f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d41645f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd
  ByteData sig1 = CryptoUtil::ConvertSignatureFromDer(
      ByteData("304402204f3ac1717f035b791005b12e41fba708d7d38cadfc4fd6ad1d53de2b4be5d416022045f743f06ff21fded63a2c7088cfe435e561dbc1c28283f0b4b152808914affd01"), &sighashtype);
  // 20ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c00105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc55
  ByteData sigm = CryptoUtil::ConvertSignatureFromDer(
      ByteData("3043022020ea09b0108c4a4a5b2769c41dea7bd546d5fe32dcdcd4bcecc6645281fd684c021f105dddaff39cb0a18c0f5f04c8275801cc18e9fc5931fb2d8c0226d2c1fc5501"), &sighashtype);
  EXPECT_EQ(64, sig1.GetDataSize());
  EXPECT_EQ(64, sigm.GetDataSize());
}